

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O1

void stbtt_Rasterize(stbtt__bitmap *result,float flatness_in_pixels,stbtt_vertex *vertices,
                    int num_verts,float scale_x,float scale_y,float shift_x,float shift_y,int x_off,
                    int y_off,int invert,void *userdata)

{
  short sVar1;
  short sVar2;
  int iVar3;
  stbtt__active_edge *z;
  void *__ptr;
  stbtt__point *points;
  ulong uVar4;
  stbtt__edge *p_00;
  float *scanline;
  undefined8 *puVar5;
  stbtt__active_edge *psVar6;
  uchar uVar7;
  long lVar8;
  stbtt__active_edge *psVar9;
  stbtt__active_edge *psVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  undefined8 *puVar15;
  size_t __size;
  undefined4 in_register_00000084;
  int iVar16;
  int iVar17;
  stbtt__edge *psVar18;
  int iVar19;
  uint uVar20;
  void *p;
  stbtt__active_edge *psVar21;
  bool bVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float y0;
  stbtt__active_edge *active;
  int num_points;
  ulong local_2f8;
  int local_2e4;
  float local_2c8;
  undefined1 local_2a0 [12];
  undefined1 auStack_294 [12];
  undefined8 *local_288;
  ulong local_280;
  float *local_278;
  float local_26c;
  undefined1 local_268 [16];
  float *local_250;
  stbtt__edge *local_248;
  ulong local_240;
  undefined8 local_238;
  int local_230;
  
  local_280 = CONCAT44(in_register_00000084,y_off);
  local_238 = local_238 & 0xffffffff00000000;
  local_268._0_4_ = num_verts;
  if (num_verts < 1) {
    uVar20 = 0;
  }
  else {
    lVar8 = 0;
    uVar20 = 0;
    do {
      uVar20 = uVar20 + ((&vertices->type)[lVar8] == '\x01');
      lVar8 = lVar8 + 0xe;
    } while ((ulong)(uint)num_verts * 0xe != lVar8);
  }
  points = (stbtt__point *)0x0;
  local_2a0._8_4_ = flatness_in_pixels;
  if (uVar20 == 0) {
    __ptr = (void *)0x0;
  }
  else {
    __ptr = malloc((long)(int)uVar20 << 2);
    if (__ptr == (void *)0x0) {
      uVar20 = 0;
      points = (stbtt__point *)0x0;
    }
    else {
      fVar23 = scale_y;
      if (scale_x <= scale_y) {
        fVar23 = scale_x;
      }
      local_2a0._8_4_ = ((float)local_2a0._8_4_ / fVar23) * ((float)local_2a0._8_4_ / fVar23);
      local_2f8 = 0;
      points = (stbtt__point *)0x0;
      iVar14 = 0;
      do {
        if (iVar14 == 0) {
LAB_00133eed:
          local_238 = local_238 & 0xffffffff00000000;
          if ((int)local_268._0_4_ < 1) {
            lVar8 = -1;
          }
          else {
            uVar12 = 0xffffffff;
            fVar26 = 0.0;
            lVar8 = 0;
            fVar23 = 0.0;
            do {
              uVar4 = local_238;
              switch((&vertices->type)[lVar8]) {
              case '\x01':
                if (-1 < (int)uVar12) {
                  *(int *)((long)__ptr + (ulong)uVar12 * 4) = (int)(float)local_238 - (int)local_2f8
                  ;
                }
                uVar12 = uVar12 + 1;
                sVar1 = *(short *)((long)&vertices->x + lVar8);
                sVar2 = *(short *)((long)&vertices->y + lVar8);
                local_2f8 = local_238 & 0xffffffff;
                break;
              case '\x02':
                sVar1 = *(short *)((long)&vertices->x + lVar8);
                sVar2 = *(short *)((long)&vertices->y + lVar8);
                break;
              case '\x03':
                stbtt__tesselate_curve
                          (points,(int *)&local_238,fVar23,fVar26,
                           (float)(int)*(short *)((long)&vertices->cx + lVar8),
                           (float)(int)*(short *)((long)&vertices->cy + lVar8),
                           (float)(int)*(short *)((long)&vertices->x + lVar8),
                           (float)(int)*(short *)((long)&vertices->y + lVar8),(float)local_2a0._8_4_
                           ,0);
                goto LAB_00134057;
              case '\x04':
                stbtt__tesselate_cubic
                          (points,(int *)&local_238,fVar23,fVar26,
                           (float)(int)*(short *)((long)&vertices->cx + lVar8),
                           (float)(int)*(short *)((long)&vertices->cy + lVar8),
                           (float)(int)*(short *)((long)&vertices->cx1 + lVar8),
                           (float)(int)*(short *)((long)&vertices->cy1 + lVar8),
                           (float)(int)*(short *)((long)&vertices->x + lVar8),
                           (float)(int)*(short *)((long)&vertices->y + lVar8),(float)local_2a0._8_4_
                           ,0);
LAB_00134057:
                fVar23 = (float)(int)*(short *)((long)&vertices->x + lVar8);
                fVar26 = (float)(int)*(short *)((long)&vertices->y + lVar8);
                uVar4 = local_238;
              default:
                goto switchD_00133f3b_default;
              }
              uVar4 = CONCAT44(local_238._4_4_,(int)(float)local_238 + 1);
              fVar26 = (float)(int)sVar2;
              fVar23 = (float)(int)sVar1;
              if (points != (stbtt__point *)0x0) {
                points[(int)(float)local_238].x = fVar23;
                points[(int)(float)local_238].y = fVar26;
              }
switchD_00133f3b_default:
              local_238 = uVar4;
              lVar8 = lVar8 + 0xe;
            } while ((ulong)(uint)num_verts * 0xe != lVar8);
            lVar8 = (long)(int)uVar12;
          }
          *(int *)((long)__ptr + lVar8 * 4) = (int)(float)local_238 - (int)local_2f8;
          bVar22 = true;
        }
        else {
          points = (stbtt__point *)malloc((long)(int)(float)local_238 << 3);
          if (points != (stbtt__point *)0x0) goto LAB_00133eed;
          points = (stbtt__point *)0x0;
          bVar22 = false;
        }
        if (!bVar22) {
          free(points);
          free(__ptr);
          uVar20 = 0;
          __ptr = (void *)0x0;
          points = (stbtt__point *)0x0;
          break;
        }
        bVar22 = iVar14 == 0;
        iVar14 = iVar14 + 1;
      } while (bVar22);
    }
  }
  if (points != (stbtt__point *)0x0) {
    local_2c8 = scale_y;
    if (invert != 0) {
      local_2c8 = -scale_y;
    }
    if ((int)uVar20 < 1) {
      __size = 0x14;
    }
    else {
      uVar4 = 0;
      lVar8 = 0;
      do {
        lVar8 = (long)(int)lVar8 + (long)*(int *)((long)__ptr + uVar4 * 4);
        uVar4 = uVar4 + 1;
      } while (uVar20 != uVar4);
      __size = lVar8 * 0x14 + 0x14;
    }
    p_00 = (stbtt__edge *)malloc(__size);
    if (p_00 != (stbtt__edge *)0x0) {
      if ((int)uVar20 < 1) {
        uVar12 = 0;
      }
      else {
        uVar4 = 0;
        uVar12 = 0;
        iVar14 = 0;
        do {
          iVar19 = *(int *)((long)__ptr + uVar4 * 4);
          if (0 < (long)iVar19) {
            lVar8 = 0;
            iVar3 = iVar19 + -1;
            do {
              fVar23 = points[(long)iVar14 + (long)iVar3].y;
              fVar26 = points[iVar14 + lVar8].y;
              iVar16 = (int)lVar8;
              if ((fVar23 != fVar26) || (NAN(fVar23) || NAN(fVar26))) {
                psVar18 = p_00 + (int)uVar12;
                p_00[(int)uVar12].invert = 0;
                iVar17 = iVar3;
                iVar13 = iVar16;
                if (invert == 0) {
                  if (fVar23 < fVar26) goto LAB_00134239;
                }
                else if (fVar26 < fVar23) {
LAB_00134239:
                  psVar18->invert = 1;
                  iVar17 = iVar16;
                  iVar13 = iVar3;
                }
                psVar18->x0 = points[(long)iVar14 + (long)iVar13].x * scale_x + shift_x;
                psVar18->y0 = points[(long)iVar14 + (long)iVar13].y * local_2c8 + shift_y;
                psVar18->x1 = points[(long)iVar14 + (long)iVar17].x * scale_x + shift_x;
                psVar18->y1 = points[(long)iVar14 + (long)iVar17].y * local_2c8 + shift_y;
                uVar12 = uVar12 + 1;
              }
              lVar8 = lVar8 + 1;
              iVar3 = iVar16;
            } while (iVar19 != lVar8);
          }
          iVar14 = iVar19 + iVar14;
          uVar4 = uVar4 + 1;
        } while (uVar4 != uVar20);
      }
      stbtt__sort_edges_quicksort(p_00,uVar12);
      if (1 < (int)uVar12) {
        uVar4 = 1;
        do {
          fVar23 = p_00[uVar4].x0;
          fVar26 = p_00[uVar4].y0;
          local_230 = p_00[uVar4].invert;
          local_238._0_4_ = p_00[uVar4].x1;
          local_238._4_4_ = p_00[uVar4].y1;
          uVar11 = uVar4 & 0xffffffff;
          do {
            uVar20 = (uint)uVar11;
            if ((int)uVar20 < 1) break;
            fVar24 = p_00[uVar11 - 1].y0;
            if (fVar26 < fVar24) {
              psVar18 = p_00 + uVar11;
              psVar18->invert = psVar18[-1].invert;
              fVar31 = psVar18[-1].y0;
              fVar25 = psVar18[-1].x1;
              fVar27 = psVar18[-1].y1;
              psVar18->x0 = psVar18[-1].x0;
              psVar18->y0 = fVar31;
              psVar18->x1 = fVar25;
              psVar18->y1 = fVar27;
              uVar11 = (ulong)(uVar20 - 1);
            }
            uVar20 = (uint)uVar11;
          } while (fVar26 < fVar24);
          if (uVar4 != uVar20) {
            p_00[(int)uVar20].x0 = fVar23;
            p_00[(int)uVar20].y0 = fVar26;
            p_00[(int)uVar20].x1 = (float)local_238;
            p_00[(int)uVar20].y1 = (float)local_238._4_4_;
            p_00[(int)uVar20].invert = local_230;
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 != uVar12);
      }
      local_2a0._0_8_ = (stbtt__active_edge *)0x0;
      uVar20 = result->w;
      if ((int)uVar20 < 0x41) {
        scanline = (float *)&local_238;
      }
      else {
        scanline = (float *)malloc((ulong)uVar20 * 8 + 4);
      }
      iVar14 = result->h;
      p_00[(int)uVar12].y0 = (float)(iVar14 + (int)local_280) + 1.0;
      uVar4 = 0;
      if (iVar14 < 1) {
        local_288 = (undefined8 *)0x0;
        puVar15 = local_288;
        psVar18 = p_00;
      }
      else {
        local_278 = scanline + (int)uVar20;
        local_26c = (float)x_off;
        local_250 = local_278 + 1;
        local_288 = (undefined8 *)0x0;
        local_2e4 = 0;
        psVar21 = (stbtt__active_edge *)0x0;
        uVar11 = local_280;
        local_248 = p_00;
        do {
          fVar23 = (float)(int)uVar11;
          fVar26 = fVar23 + 1.0;
          iVar14 = result->w;
          local_280 = uVar11;
          memset(scanline,0,(long)iVar14 * 4);
          memset(local_278,0,(long)iVar14 * 4 + 4);
          puVar15 = local_288;
          if ((stbtt__active_edge *)local_2a0._0_8_ != (stbtt__active_edge *)0x0) {
            psVar6 = (stbtt__active_edge *)local_2a0._0_8_;
            psVar9 = (stbtt__active_edge *)local_2a0;
            do {
              psVar10 = psVar6;
              if (psVar6->ey <= fVar23) {
                psVar9->next = psVar6->next;
                if ((psVar6->direction == 0.0) && (!NAN(psVar6->direction))) {
                  __assert_fail("z->direction",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/stb/include/stb/stb_truetype.h"
                                ,0xc4e,
                                "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                               );
                }
                psVar6->direction = 0.0;
                psVar6->next = psVar21;
                psVar10 = psVar9;
                psVar21 = psVar6;
              }
              psVar6 = psVar10->next;
              psVar9 = psVar10;
            } while (psVar6 != (stbtt__active_edge *)0x0);
          }
          fVar24 = p_00->y0;
          while (fVar24 <= fVar26) {
            fVar31 = p_00->y1;
            psVar6 = psVar21;
            if ((fVar24 != fVar31) || (NAN(fVar24) || NAN(fVar31))) {
              if (psVar21 == (stbtt__active_edge *)0x0) {
                if (local_2e4 == 0) {
                  puVar5 = (undefined8 *)malloc(0x6408);
                  if (puVar5 == (undefined8 *)0x0) {
                    psVar21 = (stbtt__active_edge *)0x0;
                    goto LAB_0013460d;
                  }
                  *puVar5 = puVar15;
                  local_2e4 = 800;
                  puVar15 = puVar5;
                }
                lVar8 = (long)local_2e4;
                local_2e4 = local_2e4 + -1;
                psVar21 = (stbtt__active_edge *)(puVar15 + lVar8 * 4 + -3);
              }
              else {
                psVar6 = psVar21->next;
              }
LAB_0013460d:
              if (psVar21 == (stbtt__active_edge *)0x0) {
                __assert_fail("z != __null",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/stb/include/stb/stb_truetype.h"
                              ,0xabe,
                              "stbtt__active_edge *stbtt__new_active(stbtt__hheap *, stbtt__edge *, int, float, void *)"
                             );
              }
              fVar25 = p_00->x0;
              fVar27 = (p_00->x1 - fVar25) / (fVar31 - fVar24);
              psVar21->fdx = fVar27;
              psVar21->fdy = (float)(-(uint)(fVar27 != 0.0) & (uint)(1.0 / fVar27));
              psVar21->fx = ((fVar23 - fVar24) * fVar27 + fVar25) - local_26c;
              psVar21->direction = *(float *)(&DAT_00173e60 + (ulong)(p_00->invert == 0) * 4);
              psVar21->sy = fVar24;
              psVar21->ey = fVar31;
              psVar21->next = (stbtt__active_edge *)0x0;
              if (fVar31 < fVar23) {
                __assert_fail("z->ey >= scan_y_top",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/stb/include/stb/stb_truetype.h"
                              ,0xc5b,
                              "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                             );
              }
              psVar21->next = (stbtt__active_edge *)local_2a0._0_8_;
              local_2a0._0_8_ = psVar21;
            }
            psVar18 = p_00 + 1;
            p_00 = p_00 + 1;
            psVar21 = psVar6;
            fVar24 = psVar18->y0;
          }
          local_288 = puVar15;
          local_240 = uVar4;
          if ((stbtt__active_edge *)local_2a0._0_8_ != (stbtt__active_edge *)0x0) {
            fVar24 = (float)iVar14;
            psVar6 = (stbtt__active_edge *)local_2a0._0_8_;
            do {
              fVar31 = psVar6->ey;
              if (fVar31 < fVar23) {
                __assert_fail("e->ey >= y_top",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/stb/include/stb/stb_truetype.h"
                              ,0xb92,
                              "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                             );
              }
              fVar25 = psVar6->fx;
              fVar27 = psVar6->fdx;
              if ((fVar27 != 0.0) || (NAN(fVar27))) {
                fVar28 = psVar6->sy;
                if (fVar26 < fVar28) {
                  __assert_fail("e->sy <= y_bottom && e->ey >= y_top",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/stb/include/stb/stb_truetype.h"
                                ,0xba5,
                                "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                               );
                }
                fVar33 = fVar27 + fVar25;
                fVar29 = (float)(~-(uint)(fVar23 < fVar28) & (uint)fVar25 |
                                (uint)((fVar28 - fVar23) * fVar27 + fVar25) &
                                -(uint)(fVar23 < fVar28));
                if ((((fVar29 < 0.0) ||
                     (fVar32 = (float)(~-(uint)(fVar31 < fVar26) & (uint)fVar33 |
                                      (uint)((fVar31 - fVar23) * fVar27 + fVar25) &
                                      -(uint)(fVar31 < fVar26)), fVar32 < 0.0)) ||
                    (fVar24 <= fVar29)) || (fVar24 <= fVar32)) {
                  if (0 < iVar14) {
                    local_268 = ZEXT416((uint)fVar25);
                    auStack_294 = (undefined1  [12])0x0;
                    local_2a0._8_4_ = fVar33;
                    iVar19 = 0;
                    do {
                      fVar31 = (float)iVar19;
                      iVar3 = iVar19 + 1;
                      fVar29 = (float)iVar3;
                      fVar28 = (fVar31 - fVar25) / fVar27 + fVar23;
                      fVar33 = (fVar29 - fVar25) / fVar27 + fVar23;
                      if ((fVar31 <= fVar25) || ((float)local_2a0._8_4_ <= fVar29)) {
                        if ((fVar31 <= (float)local_2a0._8_4_) || (fVar25 <= fVar29)) {
                          fVar32 = fVar23;
                          if (((fVar31 <= fVar25) || ((float)local_2a0._8_4_ <= fVar31)) &&
                             ((fVar31 <= (float)local_2a0._8_4_ || (fVar25 <= fVar31)))) {
                            fVar28 = fVar23;
                            if (((fVar25 < fVar29) && (fVar29 < (float)local_2a0._8_4_)) ||
                               ((fVar31 = fVar25, (float)local_2a0._8_4_ < fVar29 &&
                                (fVar29 < fVar25)))) goto LAB_0013495e;
                            goto LAB_00134a22;
                          }
                        }
                        else {
                          stbtt__handle_clipped_edge
                                    (scanline,iVar19,psVar6,fVar25,fVar23,fVar29,fVar33);
                          fVar25 = fVar29;
                          fVar32 = fVar33;
                        }
                        stbtt__handle_clipped_edge
                                  (scanline,iVar19,psVar6,fVar25,fVar32,fVar31,fVar28);
                      }
                      else {
                        stbtt__handle_clipped_edge
                                  (scanline,iVar19,psVar6,fVar25,fVar23,fVar31,fVar28);
                        fVar25 = fVar31;
LAB_0013495e:
                        stbtt__handle_clipped_edge
                                  (scanline,iVar19,psVar6,fVar25,fVar28,fVar29,fVar33);
                        fVar31 = fVar29;
                        fVar28 = fVar33;
                      }
LAB_00134a22:
                      stbtt__handle_clipped_edge
                                (scanline,iVar19,psVar6,fVar31,fVar28,(float)local_2a0._8_4_,fVar26)
                      ;
                      fVar25 = (float)local_268._0_4_;
                      iVar19 = iVar3;
                    } while (iVar14 != iVar3);
                  }
                }
                else {
                  if (fVar28 <= fVar23) {
                    fVar28 = fVar23;
                  }
                  uVar20 = (uint)fVar29;
                  if (fVar26 <= fVar31) {
                    fVar31 = fVar26;
                  }
                  if (uVar20 == (int)fVar32) {
                    if (((int)uVar20 < 0) || (iVar14 <= (int)uVar20)) {
                      __assert_fail("x >= 0 && x < len",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/stb/include/stb/stb_truetype.h"
                                    ,0xbc1,
                                    "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                   );
                    }
                    uVar4 = (ulong)uVar20;
                    scanline[uVar4] =
                         (((fVar32 - (float)(int)uVar20) + (fVar29 - (float)(int)uVar20)) * -0.5 +
                         1.0) * psVar6->direction * (fVar31 - fVar28) + scanline[uVar4];
                    fVar25 = (fVar31 - fVar28) * psVar6->direction;
                  }
                  else {
                    fVar27 = psVar6->fdy;
                    fVar30 = fVar32;
                    if (fVar32 < fVar29) {
                      fVar25 = fVar23 - fVar28;
                      fVar28 = (fVar23 - fVar31) + fVar26;
                      fVar27 = -fVar27;
                      fVar31 = fVar25 + fVar26;
                      fVar30 = fVar29;
                      fVar25 = fVar33;
                      fVar29 = fVar32;
                    }
                    iVar3 = (int)fVar30;
                    iVar19 = (int)fVar29 + 1;
                    fVar32 = ((float)iVar19 - fVar25) * fVar27 + fVar23;
                    fVar25 = psVar6->direction;
                    fVar33 = (fVar32 - fVar28) * fVar25;
                    lVar8 = (long)(int)fVar29;
                    scanline[lVar8] =
                         (((fVar29 - (float)(int)fVar29) + 1.0) * -0.5 + 1.0) * fVar33 +
                         scanline[lVar8];
                    if (iVar3 - iVar19 != 0 && iVar19 <= iVar3) {
                      do {
                        scanline[lVar8 + 1] = fVar27 * fVar25 * 0.5 + fVar33 + scanline[lVar8 + 1];
                        fVar33 = fVar33 + fVar27 * fVar25;
                        lVar8 = lVar8 + 1;
                      } while (iVar3 + -1 != (int)lVar8);
                    }
                    if (1.01 < ABS(fVar33)) {
                      __assert_fail("fabs(area) <= 1.01f",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/stb/include/stb/stb_truetype.h"
                                    ,0xbe6,
                                    "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                   );
                    }
                    uVar4 = (ulong)iVar3;
                    scanline[uVar4] =
                         (fVar31 - (fVar27 * (float)(iVar3 - iVar19) + fVar32)) *
                         (((fVar30 - (float)iVar3) + 0.0) * -0.5 + 1.0) * fVar25 + fVar33 +
                         scanline[uVar4];
                    fVar25 = (fVar31 - fVar28) * fVar25;
                  }
                  local_250[uVar4] = fVar25 + local_250[uVar4];
                }
              }
              else if (fVar25 < fVar24) {
                if (0.0 <= fVar25) {
                  local_268 = ZEXT416((uint)fVar25);
                  stbtt__handle_clipped_edge
                            (scanline,(int)fVar25,psVar6,fVar25,fVar23,fVar25,fVar26);
                  iVar19 = (int)fVar25 + 1;
                  fVar25 = (float)local_268._0_4_;
                }
                else {
                  iVar19 = 0;
                }
                stbtt__handle_clipped_edge(local_278,iVar19,psVar6,fVar25,fVar23,fVar25,fVar26);
              }
              psVar6 = psVar6->next;
            } while (psVar6 != (stbtt__active_edge *)0x0);
          }
          psVar6 = (stbtt__active_edge *)local_2a0._0_8_;
          if (0 < result->w) {
            fVar23 = 0.0;
            lVar8 = 0;
            do {
              fVar23 = fVar23 + local_278[lVar8];
              iVar14 = (int)(ABS(scanline[lVar8] + fVar23) * 255.0 + 0.5);
              uVar7 = (uchar)iVar14;
              if (0xfe < iVar14) {
                uVar7 = 0xff;
              }
              result->pixels[lVar8 + (long)(int)local_240 * (long)result->stride] = uVar7;
              lVar8 = lVar8 + 1;
            } while (lVar8 < result->w);
          }
          for (; psVar6 != (stbtt__active_edge *)0x0; psVar6 = psVar6->next) {
            psVar6->fx = psVar6->fdx + psVar6->fx;
          }
          uVar11 = (ulong)((int)local_280 + 1);
          uVar20 = (int)local_240 + 1;
          uVar4 = (ulong)uVar20;
          puVar15 = local_288;
          psVar18 = local_248;
        } while ((int)uVar20 < result->h);
      }
      while (local_248 = psVar18, puVar15 != (undefined8 *)0x0) {
        puVar5 = (undefined8 *)*puVar15;
        free(puVar15);
        puVar15 = puVar5;
        psVar18 = local_248;
      }
      if (scanline != (float *)&local_238) {
        free(scanline);
      }
      free(psVar18);
    }
    free(__ptr);
    free(points);
  }
  return;
}

Assistant:

STBTT_DEF void stbtt_Rasterize(stbtt__bitmap *result, float flatness_in_pixels, stbtt_vertex *vertices, int num_verts, float scale_x, float scale_y, float shift_x, float shift_y, int x_off, int y_off, int invert, void *userdata)
{
   float scale            = scale_x > scale_y ? scale_y : scale_x;
   int winding_count      = 0;
   int *winding_lengths   = NULL;
   stbtt__point *windings = stbtt_FlattenCurves(vertices, num_verts, flatness_in_pixels / scale, &winding_lengths, &winding_count, userdata);
   if (windings) {
      stbtt__rasterize(result, windings, winding_lengths, winding_count, scale_x, scale_y, shift_x, shift_y, x_off, y_off, invert, userdata);
      STBTT_free(winding_lengths, userdata);
      STBTT_free(windings, userdata);
   }
}